

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

pair<tyti::stl::basic_solid<float>,_bool> *
tyti::stl::read<float>
          (pair<tyti::stl::basic_solid<float>,_bool> *__return_storage_ptr__,string *fileName)

{
  bool local_81;
  undefined1 local_80 [7];
  bool r;
  basic_solid<float> out;
  string *fileName_local;
  
  out.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fileName;
  basic_solid<float>::basic_solid((basic_solid<float> *)local_80);
  local_81 = read<float>((basic_solid<float> *)local_80,
                         (string *)
                         out.attributes.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
  std::make_pair<tyti::stl::basic_solid<float>,bool>
            (__return_storage_ptr__,(basic_solid<float> *)local_80,&local_81);
  basic_solid<float>::~basic_solid((basic_solid<float> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<basic_solid<T>, bool> read(const std::string& fileName)
        {
            basic_solid<T> out;
            bool r = read(out, fileName);
            return std::make_pair<basic_solid<T>, bool>(std::move(out), std::move(r));
        }